

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

int jas_image_getfmt(jas_stream_t *in)

{
  bool bVar1;
  int iVar2;
  int local_24;
  int local_20;
  int i;
  int found;
  jas_image_fmtinfo_t *fmtinfo;
  jas_stream_t *in_local;
  
  bVar1 = false;
  local_20 = 0;
  _i = jas_image_fmtinfos;
  do {
    if (jas_image_numfmts <= local_20) {
LAB_00114a03:
      if (bVar1) {
        local_24 = _i->id;
      }
      else {
        local_24 = -1;
      }
      return local_24;
    }
    if ((_i->ops).validate != (_func_int_jas_stream_t_ptr *)0x0) {
      iVar2 = jas_getdbglevel();
      if (0x13 < iVar2) {
        jas_eprintf("testing for format %s ... ",_i->name);
      }
      iVar2 = (*(_i->ops).validate)(in);
      if (iVar2 == 0) {
        iVar2 = jas_getdbglevel();
        if (0x13 < iVar2) {
          jas_eprintf("test succeeded\n");
        }
        bVar1 = true;
        goto LAB_00114a03;
      }
      iVar2 = jas_getdbglevel();
      if (0x13 < iVar2) {
        jas_eprintf("test failed\n");
      }
    }
    local_20 = local_20 + 1;
    _i = _i + 1;
  } while( true );
}

Assistant:

int jas_image_getfmt(jas_stream_t *in)
{
	jas_image_fmtinfo_t *fmtinfo;
	int found;
	int i;

	/* Check for data in each of the supported formats. */
	found = 0;
	for (i = 0, fmtinfo = jas_image_fmtinfos; i < jas_image_numfmts; ++i,
	  ++fmtinfo) {
		if (fmtinfo->ops.validate) {
			/* Is the input data valid for this format? */
			JAS_DBGLOG(20, ("testing for format %s ... ", fmtinfo->name));
			if (!(*fmtinfo->ops.validate)(in)) {
				JAS_DBGLOG(20, ("test succeeded\n"));
				found = 1;
				break;
			}
			JAS_DBGLOG(20, ("test failed\n"));
		}
	}
	return found ? fmtinfo->id : (-1);
}